

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateParseFromMethods
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  string local_30;
  
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_30,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "public static $classname$ parseFrom(\n    java.nio.ByteBuffer data)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, data);\n}\npublic static $classname$ parseFrom(\n    java.nio.ByteBuffer data,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, data, extensionRegistry);\n}\npublic static $classname$ parseFrom(\n    com.google.protobuf.ByteString data)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, data);\n}\npublic static $classname$ parseFrom(\n    com.google.protobuf.ByteString data,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, data, extensionRegistry);\n}\npublic static $classname$ parseFrom(byte[] data)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, data);\n}\npublic static $classname$ parseFrom(\n    byte[] data,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, data, extensionRegistry);\n}\npublic static $classname$ parseFrom(java.io.InputStream input)\n    throws java.io.IOException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, input);\n}\npublic static $classname$ parseFrom(\n    java.io.InputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws java.io.IOException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, input, extens..." /* TRUNCATED STRING LITERAL */
                     ,"classname",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::
GenerateParseFromMethods(io::Printer* printer) {
  // Note:  These are separate from GenerateMessageSerializationMethods()
  //   because they need to be generated even for messages that are optimized
  //   for code size.
  printer->Print(
    "public static $classname$ parseFrom(\n"
    "    java.nio.ByteBuffer data)\n"
    "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
    "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
    "      DEFAULT_INSTANCE, data);\n"
    "}\n"
    "public static $classname$ parseFrom(\n"
    "    java.nio.ByteBuffer data,\n"
    "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
    "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
    "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
    "      DEFAULT_INSTANCE, data, extensionRegistry);\n"
    "}\n"
    "public static $classname$ parseFrom(\n"
    "    com.google.protobuf.ByteString data)\n"
    "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
    "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
    "      DEFAULT_INSTANCE, data);\n"
    "}\n"
    "public static $classname$ parseFrom(\n"
    "    com.google.protobuf.ByteString data,\n"
    "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
    "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
    "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
    "      DEFAULT_INSTANCE, data, extensionRegistry);\n"
    "}\n"
    "public static $classname$ parseFrom(byte[] data)\n"
    "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
    "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
    "      DEFAULT_INSTANCE, data);\n"
    "}\n"
    "public static $classname$ parseFrom(\n"
    "    byte[] data,\n"
    "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
    "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
    "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
    "      DEFAULT_INSTANCE, data, extensionRegistry);\n"
    "}\n"
    "public static $classname$ parseFrom(java.io.InputStream input)\n"
    "    throws java.io.IOException {\n"
    "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
    "      DEFAULT_INSTANCE, input);\n"
    "}\n"
    "public static $classname$ parseFrom(\n"
    "    java.io.InputStream input,\n"
    "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
    "    throws java.io.IOException {\n"
    "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
    "      DEFAULT_INSTANCE, input, extensionRegistry);\n"
    "}\n"
    "public static $classname$ parseDelimitedFrom(java.io.InputStream input)\n"
    "    throws java.io.IOException {\n"
    "  return parseDelimitedFrom(DEFAULT_INSTANCE, input);\n"
    "}\n"
    "public static $classname$ parseDelimitedFrom(\n"
    "    java.io.InputStream input,\n"
    "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
    "    throws java.io.IOException {\n"
    "  return parseDelimitedFrom(DEFAULT_INSTANCE, input, extensionRegistry);\n"
    "}\n"
    "public static $classname$ parseFrom(\n"
    "    com.google.protobuf.CodedInputStream input)\n"
    "    throws java.io.IOException {\n"
    "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
    "      DEFAULT_INSTANCE, input);\n"
    "}\n"
    "public static $classname$ parseFrom(\n"
    "    com.google.protobuf.CodedInputStream input,\n"
    "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
    "    throws java.io.IOException {\n"
    "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
    "      DEFAULT_INSTANCE, input, extensionRegistry);\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));
}